

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::FileIsDirectory(string *inName)

{
  ulong uVar1;
  int iVar2;
  size_t __n;
  char *__file;
  bool bVar3;
  string string_buffer;
  stat fs;
  char local_buffer [4096];
  char *local_10c8;
  undefined8 local_10c0;
  char local_10b8 [16];
  stat local_10a8;
  char local_1018 [4104];
  
  uVar1 = inName->_M_string_length;
  if (uVar1 == 0) {
    bVar3 = false;
  }
  else {
    local_10c8 = local_10b8;
    local_10c0 = 0;
    local_10b8[0] = '\0';
    __file = (inName->_M_dataplus)._M_p;
    __n = uVar1 - 1;
    if ((((__n != 0) && ((__file[__n] == '\\' || (__file[__n] == '/')))) &&
        ((*__file != '/' || (__file[1] != '\0')))) && (__file[uVar1 - 2] != ':')) {
      if (uVar1 < 0x1001) {
        memcpy(local_1018,__file,__n);
        *(undefined1 *)((long)local_10a8.__unused + uVar1 + 0x17) = 0;
        __file = local_1018;
      }
      else {
        std::__cxx11::string::append((char *)&local_10c8,(ulong)__file);
        __file = local_10c8;
      }
    }
    iVar2 = stat(__file,&local_10a8);
    bVar3 = (local_10a8.st_mode & 0xf000) == 0x4000 && iVar2 == 0;
    std::__cxx11::string::~string((string *)&local_10c8);
  }
  return bVar3;
}

Assistant:

bool SystemTools::UnPutEnv(const std::string& env)
{
  return kwsysUnPutEnv(env) == 0;
}